

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

istream * camp::operator>>(istream *stream,Value *value)

{
  bool bVar1;
  istream *piVar2;
  Value local_80;
  string local_38 [8];
  string str;
  Value *value_local;
  istream *stream_local;
  
  std::__cxx11::string::string(local_38);
  piVar2 = std::operator>>(stream,local_38);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if (bVar1) {
    Value::Value<std::__cxx11::string>
              (&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    Value::operator=(value,&local_80);
    Value::~Value(&local_80);
  }
  std::__cxx11::string::~string(local_38);
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, Value& value)
{
    // Use the string conversion
    std::string str;
    if (stream >> str)
        value = str;

    return stream;
}